

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t bf_load(CPUM68KState_conflict *env,uint32_t addr,int blen,uintptr_t ra)

{
  uint32_t uVar1;
  uintptr_t ra_local;
  int blen_local;
  uint32_t addr_local;
  CPUM68KState_conflict *env_local;
  
  switch(blen) {
  case 0:
    uVar1 = cpu_ldub_data_ra_m68k(env,addr,ra);
    env_local = (CPUM68KState_conflict *)(ulong)uVar1;
    break;
  case 1:
    uVar1 = cpu_lduw_data_ra_m68k(env,addr,ra);
    env_local = (CPUM68KState_conflict *)(ulong)uVar1;
    break;
  case 2:
  case 3:
    uVar1 = cpu_ldl_data_ra_m68k(env,addr,ra);
    env_local = (CPUM68KState_conflict *)(ulong)uVar1;
    break;
  case 4:
    env_local = (CPUM68KState_conflict *)cpu_ldq_data_ra_m68k(env,addr,ra);
    break;
  default:
    env_local = (CPUM68KState_conflict *)0x0;
  }
  return (uint64_t)env_local;
}

Assistant:

static uint64_t bf_load(CPUM68KState *env, uint32_t addr, int blen,
                        uintptr_t ra)
{
    switch (blen) {
    case 0:
        return cpu_ldub_data_ra(env, addr, ra);
    case 1:
        return cpu_lduw_data_ra(env, addr, ra);
    case 2:
    case 3:
        return cpu_ldl_data_ra(env, addr, ra);
    case 4:
        return cpu_ldq_data_ra(env, addr, ra);
    default:
        // g_assert_not_reached();
        return 0;
    }
}